

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SettingsUI.cpp
# Opt level: O1

void __thiscall LTSettingsUI::LTSettingsUI(LTSettingsUI *this)

{
  uint __val;
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint __len;
  array<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_14UL>
  *vs;
  WndRect _initPos;
  string __str;
  string local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  string *local_b8;
  string *local_b0;
  string *local_a8;
  string *local_a0;
  string *local_98;
  string *local_90;
  string *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  string local_50;
  
  _initPos.br = dataRefs.SUIrect.br;
  _initPos.tl = dataRefs.SUIrect.tl;
  LTImgWindow::LTImgWindow
            (&this->super_LTImgWindow,WND_MODE_FLOAT_CNT_VR,
             WND_STYLE_HUD - (dataRefs.SUItransp == 0),_initPos);
  (this->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow =
       (_func_int **)&PTR__LTSettingsUI_002dfb70;
  this->sFilter[0] = '\0';
  this->sFilter[1] = '\0';
  this->sFilter[2] = '\0';
  this->sFilter[3] = '\0';
  this->sFilter[4] = '\0';
  this->sFilter[5] = '\0';
  this->sFilter[6] = '\0';
  this->sFilter[7] = '\0';
  this->sFilter[8] = '\0';
  this->sFilter[9] = '\0';
  this->sFilter[10] = '\0';
  this->sFilter[0xb] = '\0';
  this->sFilter[0xc] = '\0';
  this->sFilter[0xd] = '\0';
  this->sFilter[0xe] = '\0';
  this->sFilter[0xf] = '\0';
  this->sFilter[0x10] = '\0';
  this->sFilter[0x11] = '\0';
  this->sFilter[0x12] = '\0';
  this->sFilter[0x13] = '\0';
  this->sFilter[0x14] = '\0';
  this->sFilter[0x15] = '\0';
  this->sFilter[0x16] = '\0';
  this->sFilter[0x17] = '\0';
  this->sFilter[0x18] = '\0';
  this->sFilter[0x19] = '\0';
  this->sFilter[0x1a] = '\0';
  this->sFilter[0x1b] = '\0';
  this->sFilter[0x1c] = '\0';
  this->sFilter[0x1d] = '\0';
  this->sFilter[0x1e] = '\0';
  this->sFilter[0x1f] = '\0';
  this->sFilter[0x20] = '\0';
  this->sFilter[0x21] = '\0';
  this->sFilter[0x22] = '\0';
  this->sFilter[0x23] = '\0';
  this->sFilter[0x24] = '\0';
  this->sFilter[0x25] = '\0';
  this->sFilter[0x26] = '\0';
  this->sFilter[0x27] = '\0';
  this->sFilter[0x28] = '\0';
  this->sFilter[0x29] = '\0';
  this->sFilter[0x2a] = '\0';
  this->sFilter[0x2b] = '\0';
  this->sFilter[0x2c] = '\0';
  this->sFilter[0x2d] = '\0';
  this->sFilter[0x2e] = '\0';
  this->sFilter[0x2f] = '\0';
  this->sFilter[0x30] = '\0';
  this->sFilter[0x31] = '\0';
  local_88 = (string *)&this->sOpenSkyUser;
  local_c0 = &(this->sOpenSkyUser).field_2;
  (this->sOpenSkyUser)._M_dataplus._M_p = (pointer)local_c0;
  (this->sOpenSkyUser)._M_string_length = 0;
  (this->sOpenSkyUser).field_2._M_local_buf[0] = '\0';
  local_90 = (string *)&this->sOpenSkyPwd;
  local_c8 = &(this->sOpenSkyPwd).field_2;
  (this->sOpenSkyPwd)._M_dataplus._M_p = (pointer)local_c8;
  (this->sOpenSkyPwd)._M_string_length = 0;
  (this->sOpenSkyPwd).field_2._M_local_buf[0] = '\0';
  this->bOpenSkyPwdClearText = false;
  this->eADSBExKeyTest = ADSBX_KEY_NO_ACTION;
  local_d0 = &(this->sADSBExKeyEntry).field_2;
  (this->sADSBExKeyEntry)._M_dataplus._M_p = (pointer)local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->sADSBExKeyEntry,dataRefs.sADSBExAPIKey._M_dataplus._M_p,
             dataRefs.sADSBExAPIKey._M_dataplus._M_p + dataRefs.sADSBExAPIKey._M_string_length);
  this->bADSBExKeyClearText = (this->sADSBExKeyEntry)._M_string_length == 0;
  lVar3 = 0x210;
  do {
    *(long *)((long)(this->super_LTImgWindow).super_ImgWindow.mModelView + lVar3 + -0x30) =
         (long)(this->super_LTImgWindow).super_ImgWindow.mModelView + lVar3 + -0x20;
    *(undefined8 *)((long)(this->super_LTImgWindow).super_ImgWindow.mModelView + lVar3 + -0x28) = 0;
    *(undefined1 *)((long)(this->super_LTImgWindow).super_ImgWindow.mModelView + lVar3 + -0x20) = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x3d0);
  local_98 = (string *)&this->sRTLicenseEntry;
  local_d8 = &(this->sRTLicenseEntry).field_2;
  (this->sRTLicenseEntry)._M_dataplus._M_p = (pointer)local_d8;
  (this->sRTLicenseEntry)._M_string_length = 0;
  (this->sRTLicenseEntry).field_2._M_local_buf[0] = '\0';
  this->bRTLicClearText = false;
  local_a0 = (string *)&this->sRTPort;
  local_e0 = &(this->sRTPort).field_2;
  (this->tmRTManTOfs).tm_sec = 0;
  (this->tmRTManTOfs).tm_min = 0;
  (this->tmRTManTOfs).tm_hour = 0;
  (this->tmRTManTOfs).tm_mday = 0;
  (this->tmRTManTOfs).tm_mon = 0;
  (this->tmRTManTOfs).tm_year = 0;
  (this->tmRTManTOfs).tm_wday = 0;
  (this->tmRTManTOfs).tm_yday = 0;
  (this->tmRTManTOfs).tm_isdst = 0;
  (this->tmRTManTOfs).tm_gmtoff = 0;
  (this->tmRTManTOfs).tm_zone = (char *)0x0;
  this->bRTModifyTOfs = false;
  this->bRTZuluTime = false;
  (this->sRTPort)._M_dataplus._M_p = (pointer)local_e0;
  (this->sRTPort)._M_string_length = 0;
  (this->sRTPort).field_2._M_local_buf[0] = '\0';
  local_a8 = (string *)&this->sFSCUser;
  local_e8 = &(this->sFSCUser).field_2;
  (this->sFSCUser)._M_dataplus._M_p = (pointer)local_e8;
  (this->sFSCUser)._M_string_length = 0;
  (this->sFSCUser).field_2._M_local_buf[0] = '\0';
  local_b0 = (string *)&this->sFSCPwd;
  local_f0 = &(this->sFSCPwd).field_2;
  (this->sFSCPwd)._M_dataplus._M_p = (pointer)local_f0;
  (this->sFSCPwd)._M_string_length = 0;
  (this->sFSCPwd).field_2._M_local_buf[0] = '\0';
  this->bFSCPwdClearText = false;
  local_f8 = &(this->sSIDisplayName).field_2;
  (this->sSIDisplayName)._M_dataplus._M_p = (pointer)local_f8;
  (this->sSIDisplayName)._M_string_length = 0;
  (this->sSIDisplayName).field_2._M_local_buf[0] = '\0';
  local_100 = &(this->txtManualMETAR).field_2;
  (this->txtManualMETAR)._M_dataplus._M_p = (pointer)local_100;
  (this->txtManualMETAR)._M_string_length = 0;
  (this->txtManualMETAR).field_2._M_local_buf[0] = '\0';
  this->cslActiveLn = -1;
  local_108 = &(this->cslEntry).field_2;
  (this->cslEntry)._M_dataplus._M_p = (pointer)local_108;
  (this->cslEntry)._M_string_length = 0;
  (this->cslEntry).field_2._M_local_buf[0] = '\0';
  this->bCslEntryExists = false;
  this->bSubDirsOpen = false;
  local_110 = &(this->cslNew).field_2;
  (this->cslNew)._M_dataplus._M_p = (pointer)local_110;
  (this->cslNew)._M_string_length = 0;
  (this->cslNew).field_2._M_local_buf[0] = '\0';
  this->bCslNewExists = false;
  this->bNewSubDirsOpen = false;
  local_118 = &(this->acTypeEntry).field_2;
  (this->acTypeEntry)._M_dataplus._M_p = (pointer)local_118;
  local_b8 = (string *)&this->sSIDisplayName;
  local_58 = &this->sADSBExKeyEntry;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->acTypeEntry,dataRefs.sDefaultAcIcaoType._M_dataplus._M_p,
             dataRefs.sDefaultAcIcaoType._M_dataplus._M_p +
             dataRefs.sDefaultAcIcaoType._M_string_length);
  this->acTypeOK = 0;
  local_120 = &(this->gndVehicleEntry).field_2;
  (this->gndVehicleEntry)._M_dataplus._M_p = (pointer)local_120;
  local_60 = &this->acTypeEntry;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->gndVehicleEntry,dataRefs.sDefaultCarIcaoType._M_dataplus._M_p,
             dataRefs.sDefaultCarIcaoType._M_dataplus._M_p +
             dataRefs.sDefaultCarIcaoType._M_string_length);
  this->gndVehicleOK = 0;
  local_68 = &this->gndVehicleEntry;
  DataRefs::GetDebugAcFilter_abi_cxx11_(&this->txtDebugFilter,&dataRefs);
  local_128 = &(this->txtFixAcType).field_2;
  (this->txtFixAcType)._M_dataplus._M_p = (pointer)local_128;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->txtFixAcType,dataRefs.cslFixAcIcaoType._M_dataplus._M_p,
             dataRefs.cslFixAcIcaoType._M_dataplus._M_p + dataRefs.cslFixAcIcaoType._M_string_length
            );
  local_78 = &this->txtFixOp;
  local_130 = &(this->txtFixOp).field_2;
  (this->txtFixOp)._M_dataplus._M_p = (pointer)local_130;
  local_70 = &this->txtFixAcType;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,dataRefs.cslFixOpIcao._M_dataplus._M_p,
             dataRefs.cslFixOpIcao._M_dataplus._M_p + dataRefs.cslFixOpIcao._M_string_length);
  local_80 = &this->txtFixLivery;
  local_138 = &(this->txtFixLivery).field_2;
  (this->txtFixLivery)._M_dataplus._M_p = (pointer)local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,dataRefs.cslFixLivery._M_dataplus._M_p,
             dataRefs.cslFixLivery._M_dataplus._M_p + dataRefs.cslFixLivery._M_string_length);
  local_140 = &(this->txtAptDump).field_2;
  (this->txtAptDump)._M_dataplus._M_p = (pointer)local_140;
  (this->txtAptDump)._M_string_length = 0;
  (this->txtAptDump).field_2._M_local_buf[0] = '\0';
  vs = &dataRefs.aFlarmToIcaoAcTy;
  lVar3 = 0x200;
  do {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
    str_concat(&local_160,vs->_M_elems,&local_50);
    std::__cxx11::string::operator=
              ((string *)
               ((long)(this->super_LTImgWindow).super_ImgWindow.mModelView + lVar3 + -0x20),
               (string *)&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar3 = lVar3 + 0x20;
    vs = (array<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_14UL>
          *)(vs->_M_elems + 1);
  } while (lVar3 != 0x3c0);
  std::__cxx11::string::_M_assign(local_88);
  std::__cxx11::string::_M_assign(local_90);
  std::__cxx11::string::_M_assign(local_98);
  uVar2 = DataRefs::GetCfgInt(DR_CFG_RT_TRAFFIC_PORT);
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar4 = (uint)uVar5;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_001b8923;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_001b8923;
      }
      if (uVar4 < 10000) goto LAB_001b8923;
      uVar5 = uVar5 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_001b8923:
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_160,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_160._M_dataplus._M_p + (uVar2 >> 0x1f),__len,__val);
  std::__cxx11::string::operator=(local_a0,(string *)&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_assign(local_a8);
  std::__cxx11::string::_M_assign(local_b0);
  std::__cxx11::string::_M_assign(local_b8);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"LiveTraffic Settings","");
  ImgWindow::SetWindowTitle((ImgWindow *)this,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  ImgWindow::SetWindowResizingLimits((ImgWindow *)this,300,300,99999,99999);
  (*(this->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[2])(this,1);
  (this->super_LTImgWindow).szHelpURL = "setup/configuration#settings-ui";
  return;
}

Assistant:

LTSettingsUI::LTSettingsUI () :
LTImgWindow(WND_MODE_FLOAT_CNT_VR,
            dataRefs.SUItransp ? WND_STYLE_HUD : WND_STYLE_SOLID,
            dataRefs.SUIrect),
// If there is no ADSBEx key yet then display any new entry in clear text,
// If a key is already defined, then by default obscure it
sADSBExKeyEntry     (dataRefs.GetADSBExAPIKey()),
bADSBExKeyClearText (sADSBExKeyEntry.empty()),
// Fill CSL type entry with current values
acTypeEntry     (dataRefs.GetDefaultAcIcaoType()),
gndVehicleEntry (dataRefs.GetDefaultCarIcaoType()),
// Fill debug entry texts with current values
txtDebugFilter  (dataRefs.GetDebugAcFilter()),
txtFixAcType    (dataRefs.cslFixAcIcaoType),
txtFixOp        (dataRefs.cslFixOpIcao),
txtFixLivery    (dataRefs.cslFixLivery)
{
    /// GNF_COUNT is not available in SettingsUI.h (due to order of include files), make _now_ sure that aFlarmAcTys has the correct size
    assert (aFlarmAcTys.size() == size_t(FAT_UAV)+1);
    
    // Fill Flarm aircraft types with current values
    for (size_t i = 0; i < aFlarmAcTys.size(); i++)
        aFlarmAcTys[i] = str_concat(dataRefs.aFlarmToIcaoAcTy[i], " ");
    
    // Fetch OpenSky credentials
    dataRefs.GetOpenSkyCredentials(sOpenSkyUser, sOpenSkyPwd);
    
    // Fetch RealTraffic license and port number
    sRTLicenseEntry = dataRefs.GetRTLicense();
    sRTPort = std::to_string(DataRefs::GetCfgInt(DR_CFG_RT_TRAFFIC_PORT));
    
    // Fetch FSC credentials
    dataRefs.GetFSCharterCredentials(sFSCUser, sFSCPwd);
    
    // Fetch SayIntentions configuration
    sSIDisplayName = dataRefs.GetSIDisplayName();

    // Set up window basics
    SetWindowTitle(SUI_WND_TITLE);
    SetWindowResizingLimits(SUI_RESIZE_LIMITS.tl.x, SUI_RESIZE_LIMITS.tl.y,
                            SUI_RESIZE_LIMITS.br.x, SUI_RESIZE_LIMITS.br.y);
    SetVisible(true);
    
    // Define Help URL to open for generic Help (?) button
    szHelpURL = HELP_SETTINGS;
}